

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwFree(void *p,char *file,int line)

{
  int iVar1;
  long lVar2;
  char local_b8 [8];
  char buffer [144];
  mwData *mw;
  int i;
  int line_local;
  char *file_local;
  void *p_local;
  
  if (file == (char *)0x0) {
    mwFree_(p);
  }
  else {
    mwAutoInit();
    if (mwTestAlways != 0) {
      mwTestNow(file,line,1);
    }
    mwCounter = mwCounter + 1;
    if (p == (void *)0x0) {
      mwWrite("NULL free: <%ld> %s(%d), NULL pointer free\'d\n",mwCounter,file,(ulong)(uint)line);
      mwFlush();
    }
    else {
      buffer._136_8_ = (long)p + (-(long)mwOverflowZoneSize - (long)mwDataSize);
      iVar1 = mwIsOwned((mwData *)buffer._136_8_,file,line);
      if (iVar1 != 0) {
        mwTestBuf((mwData *)buffer._136_8_,file,line);
        if ((*(uint *)(buffer._136_8_ + 0x34) & 1) == 0) {
          mwNumCurAlloc = mwNumCurAlloc + -1;
          mwStatCurAlloc = mwStatCurAlloc - *(long *)(buffer._136_8_ + 0x28);
          if (mwStatLevel != 0) {
            mwStatFree(*(size_t *)(buffer._136_8_ + 0x28),*(char **)(buffer._136_8_ + 0x10),
                       *(int *)(buffer._136_8_ + 0x30));
          }
          if (mwNML == 0) {
            mwUnlink((mwData *)buffer._136_8_,file,line);
            memset((void *)buffer._136_8_,0xfd,
                   *(long *)(buffer._136_8_ + 0x28) + (long)mwDataSize + (long)mwOverflowZoneSize +
                   (long)mwOverflowZoneSize);
            if (mwFBI != 0) {
              memset((void *)buffer._136_8_,0x2e,(long)(mwDataSize + mwOverflowZoneSize));
              sprintf(local_b8,"FBI<%ld>%s(%d)",mwCounter,file,(ulong)(uint)line);
              strncpy((char *)buffer._136_8_,local_b8,(long)(mwDataSize + mwOverflowZoneSize));
            }
            free((void *)buffer._136_8_);
          }
          else {
            *(uint *)(buffer._136_8_ + 0x34) = *(uint *)(buffer._136_8_ + 0x34) | 1;
            mwNmlNumAlloc = mwNmlNumAlloc + 1;
            mwNmlCurAlloc = *(long *)(buffer._136_8_ + 0x28) + mwNmlCurAlloc;
            memset((void *)(buffer._136_8_ + (long)mwDataSize + (long)mwOverflowZoneSize),0xfc,
                   *(size_t *)(buffer._136_8_ + 0x28));
          }
          mwLFfile[mwLFcur] = file;
          mwLFline[mwLFcur] = line;
          lVar2 = (long)mwLFcur;
          mwLFcur = mwLFcur + 1;
          mwLastFree[lVar2] = p;
          if (mwLFcur != 0x40) {
            return;
          }
          mwLFcur = 0;
          return;
        }
        if (*(char *)(buffer._136_8_ + (long)mwDataSize + (long)mwOverflowZoneSize) != -4) {
          mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",mwCounter,file,
                  (ulong)(uint)line,buffer._136_8_);
        }
      }
      for (mw._0_4_ = 0; (int)mw < 0x40; mw._0_4_ = (int)mw + 1) {
        if (mwLastFree[(int)mw] == p) {
          mwIncErr();
          mwWrite("double-free: <%ld> %s(%d), %p was freed from %s(%d)\n",mwCounter,file,
                  (ulong)(uint)line,p,mwLFfile[(int)mw],mwLFline[(int)mw]);
          mwFlush();
          return;
        }
      }
      mwIncErr();
      mwWrite("WILD free: <%ld> %s(%d), unknown pointer %p\n",mwCounter,file,(ulong)(uint)line,p);
      mwFlush();
    }
  }
  return;
}

Assistant:

void mwFree(void *p, const char *file, int line)
{
	int i;
	mwData *mw;
	char buffer[ sizeof(mwData) + (mwROUNDALLOC * 3) + 64 ];

	/* this code is in support of C++ delete */
	if (file == NULL) {
		mwFree_(p);
		MW_MUTEX_UNLOCK();
		return;
	}

	mwAutoInit();

	MW_MUTEX_LOCK();
	TESTS(file, line);
	mwCounter ++;

	/* on NULL free, write a warning and return */
	if (p == NULL) {
		mwWrite("NULL free: <%ld> %s(%d), NULL pointer free'd\n",
				mwCounter, file, line);
		FLUSH();
		MW_MUTEX_UNLOCK();
		return;
	}

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);

	if (mwIsOwned(mw, file, line)) {
		(void) mwTestBuf(mw, file, line);

		/* if the buffer is an NML, treat this as a double-free */
		if (mw->flag & MW_NML) {
			if (*(((unsigned char *)mw) + mwDataSize + mwOverflowZoneSize) != MW_VAL_NML) {
				mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",
						mwCounter, file, line, mw);
			}
			goto check_dbl_free;
		}

		/* update the statistics */
		mwNumCurAlloc --;
		mwStatCurAlloc -= (long) mw->size;
		if (mwStatLevel) {
			mwStatFree(mw->size, mw->file, mw->line);
		}

		/* we should either free the allocation or keep it as NML */
		if (mwNML) {
			mw->flag |= MW_NML;
			mwNmlNumAlloc ++;
			mwNmlCurAlloc += (long) mw->size;
			memset(((char *)mw) + mwDataSize + mwOverflowZoneSize, MW_VAL_NML, mw->size);
		} else {
			/* unlink the allocation, and enter the post-free data */
			mwUnlink(mw, file, line);
			memset(mw, MW_VAL_DEL,
				   mw->size + mwDataSize + mwOverflowZoneSize + mwOverflowZoneSize);
			if (mwFBI) {
				memset(mw, '.', mwDataSize + mwOverflowZoneSize);
				sprintf(buffer, "FBI<%ld>%s(%d)", mwCounter, file, line);
				strncpy((char *)(void *)mw, buffer, mwDataSize + mwOverflowZoneSize);
			}
			free(mw);
		}

		/* add the pointer to the last-free track */
		mwLFfile[ mwLFcur ] = file;
		mwLFline[ mwLFcur ] = line;
		mwLastFree[ mwLFcur++ ] = p;
		if (mwLFcur == MW_FREE_LIST) {
			mwLFcur = 0;
		}

		MW_MUTEX_UNLOCK();
		return;
	}

	/* check for double-freeing */
check_dbl_free:
	for (i = 0; i < MW_FREE_LIST; i++) {
		if (mwLastFree[i] == p) {
			mwIncErr();
			mwWrite("double-free: <%ld> %s(%d), %p was"
					" freed from %s(%d)\n",
					mwCounter, file, line, p,
					mwLFfile[i], mwLFline[i]);
			FLUSH();
			MW_MUTEX_UNLOCK();
			return;
		}
	}

	/* some weird pointer... block the free */
	mwIncErr();
	mwWrite("WILD free: <%ld> %s(%d), unknown pointer %p\n",
			mwCounter, file, line, p);
	FLUSH();
	MW_MUTEX_UNLOCK();
	return;
}